

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

size_t __thiscall
Assimp::ColladaParser::ReadPrimitives
          (ColladaParser *this,Mesh *pMesh,
          vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
          *pPerIndexChannels,size_t pNumPrimitives,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *pVCount,PrimitiveType pPrimType)

{
  bool bVar1;
  uint uVar2;
  InputChannel *channel;
  pointer pIVar3;
  pointer puVar4;
  ulong uVar5;
  Accessor *pAVar6;
  Data *pDVar7;
  size_t currentVertex;
  size_t perVertexOffset;
  ColladaParser *this_00;
  InputChannel *input;
  size_t currentPrimitive;
  size_t numOffsets;
  long lStack_c0;
  size_t numPoints;
  DataLibrary *local_a8;
  vector<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_> *local_a0;
  allocator<char> local_91;
  size_t local_90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> indices;
  char *content;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  
  perVertexOffset = 0xffffffffffffffff;
  numOffsets = 1;
  for (pIVar3 = (pPerIndexChannels->
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pIVar3 != (pPerIndexChannels->
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                )._M_impl.super__Vector_impl_data._M_finish; pIVar3 = pIVar3 + 1) {
    uVar5 = pIVar3->mOffset + 1;
    if (numOffsets <= uVar5) {
      numOffsets = uVar5;
    }
    if (pIVar3->mType == IT_Vertex) {
      perVertexOffset = pIVar3->mOffset;
    }
  }
  local_a0 = pPerIndexChannels;
  __range2 = pVCount;
  if (pPrimType == Prim_Lines) {
    local_a8 = (DataLibrary *)(pNumPrimitives * 2);
LAB_003fe571:
    indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_a8 == (DataLibrary *)0x0) goto LAB_003fe5a9;
    this_00 = (ColladaParser *)&indices;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,
               (long)local_a8 * numOffsets);
    bVar1 = false;
  }
  else {
    if (pPrimType == Prim_Triangles) {
      local_a8 = (DataLibrary *)(pNumPrimitives * 3);
      goto LAB_003fe571;
    }
    if (pPrimType == Prim_Polylist) {
      local_a8 = (DataLibrary *)0x0;
      for (puVar4 = (pVCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          puVar4 != (pVCount->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish; puVar4 = puVar4 + 1) {
        local_a8 = (DataLibrary *)((long)local_a8 + *puVar4);
      }
      goto LAB_003fe571;
    }
LAB_003fe5a9:
    indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    bVar1 = true;
    local_a8 = (DataLibrary *)0x0;
    this_00 = this;
  }
  if (pNumPrimitives != 0) {
    local_90 = pNumPrimitives;
    content = GetTextContent(this);
    while (this_00 = (ColladaParser *)content, pNumPrimitives = local_90, *content != '\0') {
      uVar2 = strtol10(content,&content);
      numPoints = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        numPoints = 0;
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&indices,&numPoints);
      SkipSpacesAndLineEnd<char>(&content);
    }
  }
  uVar5 = (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (bVar1) {
    if (uVar5 % numOffsets != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&content,"Expected different index count in <p> element.",
                 (allocator<char> *)&numPoints);
      ThrowException(this,(string *)&content);
    }
  }
  else if (uVar5 != (long)local_a8 * numOffsets) {
    if (pPrimType != Prim_Lines) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&content,"Expected different index count in <p> element.",
                 (allocator<char> *)&numPoints);
      ThrowException(this,(string *)&content);
    }
    ReportWarning(this_00,"Expected different index count in <p> element, %zu instead of %zu.",uVar5
                 );
    pNumPrimitives =
         (ulong)((long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_start >> 3) / numOffsets >> 1;
  }
  local_a8 = &this->mDataLibrary;
  local_90 = pNumPrimitives;
  for (pIVar3 = (pMesh->mPerVertexData).
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pIVar3 != (pMesh->mPerVertexData).
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                ._M_impl.super__Vector_impl_data._M_finish; pIVar3 = pIVar3 + 1) {
    if (pIVar3->mResolved == (Accessor *)0x0) {
      pAVar6 = ResolveLibraryReference<Assimp::Collada::Accessor>
                         (this,&this->mAccessorLibrary,&pIVar3->mAccessor);
      pIVar3->mResolved = pAVar6;
      if (pAVar6->mData == (Data *)0x0) {
        pDVar7 = ResolveLibraryReference<Assimp::Collada::Data>(this,local_a8,&pAVar6->mSource);
        pAVar6->mData = pDVar7;
      }
    }
  }
  for (pIVar3 = (local_a0->
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pIVar3 != (local_a0->
                super__Vector_base<Assimp::Collada::InputChannel,_std::allocator<Assimp::Collada::InputChannel>_>
                )._M_impl.super__Vector_impl_data._M_finish; pIVar3 = pIVar3 + 1) {
    if (pIVar3->mResolved == (Accessor *)0x0) {
      if (pIVar3->mType == IT_Vertex) {
        bVar1 = std::operator!=(&pIVar3->mAccessor,&pMesh->mVertexID);
        if (bVar1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&content,"Unsupported vertex referencing scheme.",
                     (allocator<char> *)&numPoints);
          ThrowException(this,(string *)&content);
        }
      }
      else {
        pAVar6 = ResolveLibraryReference<Assimp::Collada::Accessor>
                           (this,&this->mAccessorLibrary,&pIVar3->mAccessor);
        pIVar3->mResolved = pAVar6;
        if (pAVar6->mData == (Data *)0x0) {
          pDVar7 = ResolveLibraryReference<Assimp::Collada::Data>(this,local_a8,&pAVar6->mSource);
          pAVar6->mData = pDVar7;
        }
      }
    }
  }
  if ((pPrimType & ~Prim_LineStrip) == Prim_TriFans) {
    local_90 = 1;
  }
  if (pPrimType == Prim_LineStrip) {
    lStack_c0 = -1;
  }
  else {
    if (pPrimType != Prim_TriStrips) goto LAB_003fe7c3;
    lStack_c0 = -2;
  }
  local_90 = (ulong)((long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) / numOffsets + lStack_c0;
LAB_003fe7c3:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&pMesh->mFaceSize,local_90);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            (&pMesh->mFacePosIndices,
             (ulong)((long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) / numOffsets);
  local_a8 = (DataLibrary *)0x0;
  for (currentPrimitive = 0; currentPrimitive != local_90; currentPrimitive = currentPrimitive + 1)
  {
    numPoints = 0;
    switch(pPrimType) {
    case Prim_Lines:
      numPoints = 2;
      for (uVar5 = 0; uVar5 < numPoints; uVar5 = uVar5 + 1) {
        CopyVertex(this,uVar5,numOffsets,numPoints,perVertexOffset,pMesh,local_a0,currentPrimitive,
                   &indices);
      }
      break;
    case Prim_LineStrip:
      numPoints = 2;
      for (uVar5 = 0; uVar5 < numPoints; uVar5 = uVar5 + 1) {
        CopyVertex(this,uVar5,numOffsets,1,perVertexOffset,pMesh,local_a0,currentPrimitive,&indices)
        ;
      }
      break;
    case Prim_Triangles:
      numPoints = 3;
      for (uVar5 = 0; uVar5 < numPoints; uVar5 = uVar5 + 1) {
        CopyVertex(this,uVar5,numOffsets,numPoints,perVertexOffset,pMesh,local_a0,currentPrimitive,
                   &indices);
      }
      break;
    case Prim_TriStrips:
      numPoints = 3;
      ReadPrimTriStrips(this,numOffsets,perVertexOffset,pMesh,local_a0,currentPrimitive,&indices);
      break;
    case Prim_TriFans:
    case Prim_Polygon:
      numPoints = (ulong)((long)indices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)indices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3) / numOffsets;
      for (uVar5 = 0; uVar5 < numPoints; uVar5 = uVar5 + 1) {
        CopyVertex(this,uVar5,numOffsets,numPoints,perVertexOffset,pMesh,local_a0,currentPrimitive,
                   &indices);
      }
      break;
    case Prim_Polylist:
      numPoints = (__range2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                  _M_impl.super__Vector_impl_data._M_start[currentPrimitive];
      for (uVar5 = 0; uVar5 < numPoints; uVar5 = uVar5 + 1) {
        CopyVertex(this,(long)local_a8 + uVar5,numOffsets,1,perVertexOffset,pMesh,local_a0,0,
                   &indices);
      }
      local_a8 = (DataLibrary *)((long)local_a8 + numPoints);
      break;
    default:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&content,"Unsupported primitive type.",&local_91);
      ThrowException(this,(string *)&content);
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (&pMesh->mFaceSize,&numPoints);
  }
  TestClosing(this,"p");
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return local_90;
}

Assistant:

size_t ColladaParser::ReadPrimitives(Mesh* pMesh, std::vector<InputChannel>& pPerIndexChannels,
    size_t pNumPrimitives, const std::vector<size_t>& pVCount, PrimitiveType pPrimType)
{
    // determine number of indices coming per vertex
    // find the offset index for all per-vertex channels
    size_t numOffsets = 1;
    size_t perVertexOffset = SIZE_MAX; // invalid value
    for (const InputChannel& channel : pPerIndexChannels)
    {
        numOffsets = std::max(numOffsets, channel.mOffset + 1);
        if (channel.mType == IT_Vertex)
            perVertexOffset = channel.mOffset;
    }

    // determine the expected number of indices
    size_t expectedPointCount = 0;
    switch (pPrimType)
    {
    case Prim_Polylist:
    {
        for (size_t i : pVCount)
            expectedPointCount += i;
        break;
    }
    case Prim_Lines:
        expectedPointCount = 2 * pNumPrimitives;
        break;
    case Prim_Triangles:
        expectedPointCount = 3 * pNumPrimitives;
        break;
    default:
        // other primitive types don't state the index count upfront... we need to guess
        break;
    }

    // and read all indices into a temporary array
    std::vector<size_t> indices;
    if (expectedPointCount > 0)
        indices.reserve(expectedPointCount * numOffsets);

    if (pNumPrimitives > 0) // It is possible to not contain any indices
    {
        const char* content = GetTextContent();
        while (*content != 0)
        {
            // read a value.
            // Hack: (thom) Some exporters put negative indices sometimes. We just try to carry on anyways.
            int value = std::max(0, strtol10(content, &content));
            indices.push_back(size_t(value));
            // skip whitespace after it
            SkipSpacesAndLineEnd(&content);
        }
    }

    // complain if the index count doesn't fit
    if (expectedPointCount > 0 && indices.size() != expectedPointCount * numOffsets) {
        if (pPrimType == Prim_Lines) {
            // HACK: We just fix this number since SketchUp 15.3.331 writes the wrong 'count' for 'lines'
            ReportWarning("Expected different index count in <p> element, %zu instead of %zu.", indices.size(), expectedPointCount * numOffsets);
            pNumPrimitives = (indices.size() / numOffsets) / 2;
        }
        else
            ThrowException("Expected different index count in <p> element.");

    }
    else if (expectedPointCount == 0 && (indices.size() % numOffsets) != 0)
        ThrowException("Expected different index count in <p> element.");

    // find the data for all sources
    for (std::vector<InputChannel>::iterator it = pMesh->mPerVertexData.begin(); it != pMesh->mPerVertexData.end(); ++it)
    {
        InputChannel& input = *it;
        if (input.mResolved)
            continue;

        // find accessor
        input.mResolved = &ResolveLibraryReference(mAccessorLibrary, input.mAccessor);
        // resolve accessor's data pointer as well, if necessary
        const Accessor* acc = input.mResolved;
        if (!acc->mData)
            acc->mData = &ResolveLibraryReference(mDataLibrary, acc->mSource);
    }
    // and the same for the per-index channels
    for (std::vector<InputChannel>::iterator it = pPerIndexChannels.begin(); it != pPerIndexChannels.end(); ++it)
    {
        InputChannel& input = *it;
        if (input.mResolved)
            continue;

        // ignore vertex pointer, it doesn't refer to an accessor
        if (input.mType == IT_Vertex)
        {
            // warn if the vertex channel does not refer to the <vertices> element in the same mesh
            if (input.mAccessor != pMesh->mVertexID)
                ThrowException("Unsupported vertex referencing scheme.");
            continue;
        }

        // find accessor
        input.mResolved = &ResolveLibraryReference(mAccessorLibrary, input.mAccessor);
        // resolve accessor's data pointer as well, if necessary
        const Accessor* acc = input.mResolved;
        if (!acc->mData)
            acc->mData = &ResolveLibraryReference(mDataLibrary, acc->mSource);
    }

    // For continued primitives, the given count does not come all in one <p>, but only one primitive per <p>
    size_t numPrimitives = pNumPrimitives;
    if (pPrimType == Prim_TriFans || pPrimType == Prim_Polygon)
        numPrimitives = 1;
    // For continued primitives, the given count is actually the number of <p>'s inside the parent tag
    if (pPrimType == Prim_TriStrips) {
        size_t numberOfVertices = indices.size() / numOffsets;
        numPrimitives = numberOfVertices - 2;
    }
    if (pPrimType == Prim_LineStrip) {
        size_t numberOfVertices = indices.size() / numOffsets;
        numPrimitives = numberOfVertices - 1;
    }

    pMesh->mFaceSize.reserve(numPrimitives);
    pMesh->mFacePosIndices.reserve(indices.size() / numOffsets);

    size_t polylistStartVertex = 0;
    for (size_t currentPrimitive = 0; currentPrimitive < numPrimitives; currentPrimitive++)
    {
        // determine number of points for this primitive
        size_t numPoints = 0;
        switch (pPrimType)
        {
        case Prim_Lines:
            numPoints = 2;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_LineStrip:
            numPoints = 2;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_Triangles:
            numPoints = 3;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_TriStrips:
            numPoints = 3;
            ReadPrimTriStrips(numOffsets, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        case Prim_Polylist:
            numPoints = pVCount[currentPrimitive];
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(polylistStartVertex + currentVertex, numOffsets, 1, perVertexOffset, pMesh, pPerIndexChannels, 0, indices);
            polylistStartVertex += numPoints;
            break;
        case Prim_TriFans:
        case Prim_Polygon:
            numPoints = indices.size() / numOffsets;
            for (size_t currentVertex = 0; currentVertex < numPoints; currentVertex++)
                CopyVertex(currentVertex, numOffsets, numPoints, perVertexOffset, pMesh, pPerIndexChannels, currentPrimitive, indices);
            break;
        default:
            // LineStrip is not supported due to expected index unmangling
            ThrowException("Unsupported primitive type.");
            break;
        }

        // store the face size to later reconstruct the face from
        pMesh->mFaceSize.push_back(numPoints);
    }

    // if I ever get my hands on that guy who invented this steaming pile of indirection...
    TestClosing("p");
    return numPrimitives;
}